

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O1

int mp_exptmod_fast(mp_int *G,mp_int *X,mp_int *P,mp_int *Y,int redmode)

{
  mp_int *pmVar1;
  undefined8 uVar2;
  mp_int *pmVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  mp_digit *pmVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  mp_int *pmVar12;
  mp_int *b;
  mp_digit mVar13;
  mp_digit **ppmVar14;
  int iVar15;
  long lVar16;
  mp_int res;
  mp_digit mp;
  mp_int t;
  mp_int M [256];
  int local_18d0;
  code *local_18c8;
  mp_int local_18b8;
  mp_int *local_1898;
  mp_int *local_1890;
  ulong local_1888;
  mp_int *local_1880;
  int local_1874;
  mp_int *local_1870;
  ulong local_1868;
  mp_int *local_1860;
  mp_int local_1858;
  mp_int mStack_1838;
  mp_int local_1820 [255];
  
  iVar9 = X->used;
  if ((long)iVar9 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = (iVar9 + -1) * 0x3c;
    uVar8 = X->dp[(long)iVar9 + -1];
    if (uVar8 != 0) {
      lVar16 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar16 == 0; lVar16 = lVar16 + -1) {
        }
      }
      iVar4 = (iVar4 - ((uint)lVar16 ^ 0x3f)) + 0x40;
    }
  }
  local_1868 = 2;
  if ((((7 < iVar4) && (local_1868 = 3, 0x24 < iVar4)) && (local_1868 = 4, 0x8c < iVar4)) &&
     ((local_1868 = 5, 0x1c2 < iVar4 && (local_1868 = 6, 0x517 < iVar4)))) {
    local_1868 = (ulong)((0xdc9 < iVar4) + 7);
  }
  local_1880 = G;
  local_1820[0].dp = (mp_digit *)malloc(0x100);
  if (local_1820[0].dp == (mp_digit *)0x0) {
    return -2;
  }
  local_1898 = P;
  local_1874 = redmode;
  memset(local_1820[0].dp,0,0x100);
  local_1820[0].used = 0;
  local_1820[0].alloc = 0x20;
  local_1820[0].sign = 0;
  iVar9 = (int)local_1868 + -1;
  uVar5 = 1 << ((byte)iVar9 & 0x1f);
  uVar10 = 1 << ((byte)local_1868 & 0x1f);
  local_1870 = X;
  local_1860 = Y;
  if (uVar5 < uVar10) {
    uVar8 = (ulong)uVar5;
    local_1888 = uVar8 * 3;
    ppmVar14 = &local_1820[uVar8 - 1].dp;
    lVar16 = 0;
    do {
      pmVar7 = (mp_digit *)malloc(0x100);
      *ppmVar14 = pmVar7;
      if (pmVar7 == (mp_digit *)0x0) {
        if (uVar5 < uVar5 - (int)lVar16) {
          lVar16 = -lVar16;
          pmVar12 = (mp_int *)(&mStack_1838.used + local_1888 * 2);
          do {
            mp_clear(pmVar12);
            pmVar12 = pmVar12 + 1;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        pmVar7 = local_1820[0].dp;
        if (local_1820[0].dp == (mp_digit *)0x0) {
          return -2;
        }
        if (0 < (long)local_1820[0].used) {
          memset(local_1820[0].dp,0,(long)local_1820[0].used << 3);
        }
        free(pmVar7);
        return -2;
      }
      memset(pmVar7,0,0x100);
      ((mp_int *)(ppmVar14 + -2))->used = 0;
      ((mp_int *)(ppmVar14 + -2))->alloc = 0x20;
      *(int *)(ppmVar14 + -1) = 0;
      lVar16 = lVar16 + -1;
      ppmVar14 = ppmVar14 + 3;
    } while (uVar8 - uVar10 != lVar16);
  }
  iVar4 = local_1874;
  pmVar12 = local_1898;
  if (local_1874 == 0) {
    iVar6 = mp_montgomery_setup(local_1898,(mp_digit *)&local_1890);
    if (iVar6 != 0) goto LAB_0010877b;
    local_18c8 = fast_mp_montgomery_reduce;
    if (0x1ff < pmVar12->used * 2 + 1) {
      local_18c8 = mp_montgomery_reduce;
    }
    if (0xff < pmVar12->used) {
      local_18c8 = mp_montgomery_reduce;
    }
  }
  else if (local_1874 == 1) {
    local_1890 = (mp_int *)(0x1000000000000000 - *local_1898->dp);
    local_18c8 = mp_dr_reduce;
  }
  else {
    iVar6 = mp_reduce_2k_setup(local_1898,(mp_digit *)&local_1890);
    if (iVar6 != 0) goto LAB_0010877b;
    local_18c8 = mp_reduce_2k;
  }
  pmVar7 = (mp_digit *)malloc(0x100);
  local_18b8.dp = pmVar7;
  if (pmVar7 == (mp_digit *)0x0) {
    iVar6 = -2;
    goto LAB_0010877b;
  }
  memset(pmVar7,0,0x100);
  local_18b8.used = 0;
  local_18b8.alloc = 0x20;
  local_18b8._8_8_ = local_18b8._8_8_ & 0xffffffff00000000;
  if (iVar4 == 0) {
    iVar6 = mp_montgomery_calc_normalization(&local_18b8,pmVar12);
    if (iVar6 != 0) goto LAB_00108738;
    iVar6 = mp_mulmod(local_1880,&local_18b8,pmVar12,local_1820);
  }
  else {
    local_18b8.used = 0;
    local_18b8.alloc = 0x20;
    memset(pmVar7,0,0x100);
    *pmVar7 = 1;
    local_18b8.used = 1;
    iVar6 = mp_mod(local_1880,pmVar12,local_1820);
  }
  if (iVar6 == 0) {
    uVar8 = (ulong)uVar5;
    b = &mStack_1838 + uVar8;
    iVar6 = mp_copy(local_1820,b);
    pmVar1 = local_1890;
    if (iVar6 == 0) {
      iVar4 = 1;
      if (1 < iVar9) {
        iVar4 = iVar9;
      }
      do {
        iVar6 = s_mp_sqr(b,b);
        local_1820[uVar8 - 1].sign = 0;
        if ((iVar6 != 0) ||
           (iVar6 = (*local_18c8)(b,pmVar12,pmVar1), pmVar3 = local_1890, iVar6 != 0))
        goto LAB_00108738;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      pmVar12 = &mStack_1838 + uVar8;
      do {
        uVar8 = uVar8 + 1;
        if (uVar10 <= uVar8) {
          iVar15 = local_1870->used + -1;
          iVar4 = 1;
          mVar13 = 0;
          local_1880 = local_1890;
          local_1888 = local_1888 & 0xffffffff00000000;
          local_18d0 = 0;
          iVar9 = 0;
          goto LAB_00108857;
        }
        pmVar1 = pmVar12 + 1;
        iVar6 = mp_mul(pmVar12,local_1820,pmVar1);
        if (iVar6 != 0) break;
        pmVar12 = pmVar12 + 1;
        iVar6 = (*local_18c8)(pmVar1,local_1898,pmVar3);
      } while (iVar6 == 0);
    }
  }
  goto LAB_00108738;
  while (iVar9 = 1, iVar6 == 0) {
LAB_00108857:
    do {
      iVar6 = iVar9;
      pmVar1 = local_1890;
      pmVar12 = local_1898;
      iVar4 = iVar4 + -1;
      if (iVar4 == 0) {
        if (iVar15 == -1) {
          if (local_18d0 < 1 || iVar6 != 2) goto LAB_00108a3d;
          uVar11 = (uint)local_1888;
          goto LAB_001089cf;
        }
        lVar16 = (long)iVar15;
        iVar15 = iVar15 + -1;
        mVar13 = local_1870->dp[lVar16];
        iVar4 = 0x3c;
      }
      uVar11 = (uint)(mVar13 >> 0x3b) & 1;
      mVar13 = mVar13 * 2;
      iVar9 = 0;
    } while (iVar6 == 0 && uVar11 == 0);
    if ((iVar6 == 1) && (uVar11 == 0)) {
      iVar6 = s_mp_sqr(&local_18b8,&local_18b8);
      local_18b8._8_8_ = local_18b8._8_8_ & 0xffffffff00000000;
      if (iVar6 != 0) break;
      iVar6 = (*local_18c8)(&local_18b8,local_1898,local_1880);
    }
    else {
      local_18d0 = local_18d0 + 1;
      local_1888 = CONCAT44(local_1888._4_4_,
                            (uint)local_1888 |
                            uVar11 << ((char)local_1868 - (char)local_18d0 & 0x1fU));
      uVar8 = local_1868 & 0xffffffff;
      iVar9 = 2;
      if ((int)local_1868 != local_18d0) goto LAB_00108857;
      do {
        iVar6 = s_mp_sqr(&local_18b8,&local_18b8);
        local_18b8._8_8_ = local_18b8._8_8_ & 0xffffffff00000000;
        if ((iVar6 != 0) || (iVar6 = (*local_18c8)(&local_18b8,local_1898,local_1880), iVar6 != 0))
        goto LAB_00108738;
        uVar11 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar11;
      } while (uVar11 != 0);
      iVar6 = mp_mul(&local_18b8,&mStack_1838 + (int)(uint)local_1888,&local_18b8);
      if (iVar6 != 0) break;
      iVar6 = (*local_18c8)(&local_18b8,local_1898,local_1880);
      local_1888 = local_1888 & 0xffffffff00000000;
      local_18d0 = 0;
    }
  }
  goto LAB_00108738;
  while (local_18d0 = local_18d0 + -1, local_18d0 != 0) {
LAB_001089cf:
    iVar6 = s_mp_sqr(&local_18b8,&local_18b8);
    local_18b8._8_8_ = local_18b8._8_8_ & 0xffffffff00000000;
    if (((iVar6 != 0) || (iVar6 = (*local_18c8)(&local_18b8,pmVar12,pmVar1), iVar6 != 0)) ||
       ((uVar11 = uVar11 * 2, (uVar11 & uVar10) != 0 &&
        ((iVar6 = mp_mul(&local_18b8,local_1820,&local_18b8), iVar6 != 0 ||
         (iVar6 = (*local_18c8)(&local_18b8,pmVar12,pmVar1), iVar6 != 0)))))) goto LAB_00108738;
  }
LAB_00108a3d:
  if ((local_1874 != 0) || (iVar6 = (*local_18c8)(&local_18b8,pmVar12,local_1890), iVar6 == 0)) {
    local_1858.dp = local_18b8.dp;
    local_1858.used = local_18b8.used;
    local_1858.alloc = local_18b8.alloc;
    local_1858._8_8_ = local_18b8._8_8_;
    pmVar7 = local_1860->dp;
    uVar2._0_4_ = local_1860->used;
    uVar2._4_4_ = local_1860->alloc;
    uVar8 = *(ulong *)&local_1860->sign;
    local_1860->used = local_18b8.used;
    local_1860->alloc = local_18b8.alloc;
    local_1860->sign = local_18b8.sign;
    *(undefined4 *)&local_1860->field_0xc = local_18b8._12_4_;
    local_1860->dp = local_18b8.dp;
    iVar6 = 0;
    local_18b8._0_8_ = uVar2;
    local_18b8._8_8_ = uVar8;
    local_18b8.dp = pmVar7;
  }
LAB_00108738:
  pmVar7 = local_18b8.dp;
  if (local_18b8.dp != (mp_digit *)0x0) {
    if (0 < (long)local_18b8.used) {
      memset(local_18b8.dp,0,(long)local_18b8.used << 3);
    }
    free(pmVar7);
    local_18b8.dp = (mp_digit *)0x0;
    local_18b8.used = 0;
    local_18b8.alloc = 0;
    local_18b8._8_8_ = local_18b8._8_8_ & 0xffffffff00000000;
  }
LAB_0010877b:
  pmVar7 = local_1820[0].dp;
  if (local_1820[0].dp != (mp_digit *)0x0) {
    if (0 < (long)local_1820[0].used) {
      memset(local_1820[0].dp,0,(long)local_1820[0].used << 3);
    }
    free(pmVar7);
    local_1820[0].dp = (mp_digit *)0x0;
    local_1820[0].used = 0;
    local_1820[0].alloc = 0;
    local_1820[0].sign = 0;
  }
  if (uVar5 < uVar10) {
    pmVar12 = &mStack_1838 + uVar5;
    lVar16 = (ulong)uVar10 - (ulong)uVar5;
    do {
      mp_clear(pmVar12);
      pmVar12 = pmVar12 + 1;
      lVar16 = lVar16 + -1;
    } while (lVar16 != 0);
  }
  return iVar6;
}

Assistant:

int mp_exptmod_fast (mp_int * G, mp_int * X, mp_int * P, mp_int * Y, int redmode)
{
  mp_int  M[TAB_SIZE], res;
  mp_digit buf, mp;
  int     err, bitbuf, bitcpy, bitcnt, mode, digidx, x, y, winsize;

  /* use a pointer to the reduction algorithm.  This allows us to use
   * one of many reduction algorithms without modding the guts of
   * the code with if statements everywhere.
   */
  int     (*redux)(mp_int*,mp_int*,mp_digit);

  /* find window size */
  x = mp_count_bits (X);
  if (x <= 7) {
    winsize = 2;
  } else if (x <= 36) {
    winsize = 3;
  } else if (x <= 140) {
    winsize = 4;
  } else if (x <= 450) {
    winsize = 5;
  } else if (x <= 1303) {
    winsize = 6;
  } else if (x <= 3529) {
    winsize = 7;
  } else {
    winsize = 8;
  }

  /* init M array */
  /* init first cell */
  if ((err = mp_init(&M[1])) != MP_OKAY) {
     return err;
  }

  /* now init the second half of the array */
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    if ((err = mp_init(&M[x])) != MP_OKAY) {
      for (y = 1<<(winsize-1); y < x; y++) {
        mp_clear (&M[y]);
      }
      mp_clear(&M[1]);
      return err;
    }
  }

  /* determine and setup reduction code */
  if (redmode == 0) {
     /* now setup montgomery  */
     if ((err = mp_montgomery_setup (P, &mp)) != MP_OKAY) {
        goto LBL_M;
     }

     /* automatically pick the comba one if available (saves quite a few calls/ifs) */
     if (((P->used * 2 + 1) < MP_WARRAY) &&
          P->used < (1 << ((CHAR_BIT * sizeof (mp_word)) - (2 * DIGIT_BIT)))) {
        redux = fast_mp_montgomery_reduce;
     } else 
     {
        /* use slower baseline Montgomery method */
        redux = mp_montgomery_reduce;
     }
  } else if (redmode == 1) {
     /* setup DR reduction for moduli of the form B**k - b */
     mp_dr_setup(P, &mp);
     redux = mp_dr_reduce;
  } else {
     /* setup DR reduction for moduli of the form 2**k - b */
     if ((err = mp_reduce_2k_setup(P, &mp)) != MP_OKAY) {
        goto LBL_M;
     }
     redux = mp_reduce_2k;
  }

  /* setup result */
  if ((err = mp_init (&res)) != MP_OKAY) {
    goto LBL_M;
  }

  /* create M table
   *

   *
   * The first half of the table is not computed though accept for M[0] and M[1]
   */

  if (redmode == 0) {
     /* now we need R mod m */
     if ((err = mp_montgomery_calc_normalization (&res, P)) != MP_OKAY) {
       goto LBL_RES;
     }

     /* now set M[1] to G * R mod m */
     if ((err = mp_mulmod (G, &res, P, &M[1])) != MP_OKAY) {
       goto LBL_RES;
     }
  } else {
     mp_set(&res, 1);
     if ((err = mp_mod(G, P, &M[1])) != MP_OKAY) {
        goto LBL_RES;
     }
  }

  /* compute the value at M[1<<(winsize-1)] by squaring M[1] (winsize-1) times */
  if ((err = mp_copy (&M[1], &M[1 << (winsize - 1)])) != MP_OKAY) {
    goto LBL_RES;
  }

  for (x = 0; x < (winsize - 1); x++) {
    if ((err = mp_sqr (&M[1 << (winsize - 1)], &M[1 << (winsize - 1)])) != MP_OKAY) {
      goto LBL_RES;
    }
    if ((err = redux (&M[1 << (winsize - 1)], P, mp)) != MP_OKAY) {
      goto LBL_RES;
    }
  }

  /* create upper table */
  for (x = (1 << (winsize - 1)) + 1; x < (1 << winsize); x++) {
    if ((err = mp_mul (&M[x - 1], &M[1], &M[x])) != MP_OKAY) {
      goto LBL_RES;
    }
    if ((err = redux (&M[x], P, mp)) != MP_OKAY) {
      goto LBL_RES;
    }
  }

  /* set initial mode and bit cnt */
  mode   = 0;
  bitcnt = 1;
  buf    = 0;
  digidx = X->used - 1;
  bitcpy = 0;
  bitbuf = 0;

  for (;;) {
    /* grab next digit as required */
    if (--bitcnt == 0) {
      /* if digidx == -1 we are out of digits so break */
      if (digidx == -1) {
        break;
      }
      /* read next digit and reset bitcnt */
      buf    = X->dp[digidx--];
      bitcnt = (int)DIGIT_BIT;
    }

    /* grab the next msb from the exponent */
    y     = (mp_digit)(buf >> (DIGIT_BIT - 1)) & 1;
    buf <<= (mp_digit)1;

    /* if the bit is zero and mode == 0 then we ignore it
     * These represent the leading zero bits before the first 1 bit
     * in the exponent.  Technically this opt is not required but it
     * does lower the # of trivial squaring/reductions used
     */
    if (mode == 0 && y == 0) {
      continue;
    }

    /* if the bit is zero and mode == 1 then we square */
    if (mode == 1 && y == 0) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }
      continue;
    }

    /* else we add it to the window */
    bitbuf |= (y << (winsize - ++bitcpy));
    mode    = 2;

    if (bitcpy == winsize) {
      /* ok window is filled so square as required and multiply  */
      /* square first */
      for (x = 0; x < winsize; x++) {
        if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, mp)) != MP_OKAY) {
          goto LBL_RES;
        }
      }

      /* then multiply */
      if ((err = mp_mul (&res, &M[bitbuf], &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* empty window and reset */
      bitcpy = 0;
      bitbuf = 0;
      mode   = 1;
    }
  }

  /* if bits remain then square/multiply */
  if (mode == 2 && bitcpy > 0) {
    /* square then multiply if the bit is set */
    for (x = 0; x < bitcpy; x++) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, mp)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* get next bit of the window */
      bitbuf <<= 1;
      if ((bitbuf & (1 << winsize)) != 0) {
        /* then multiply */
        if ((err = mp_mul (&res, &M[1], &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, mp)) != MP_OKAY) {
          goto LBL_RES;
        }
      }
    }
  }

  if (redmode == 0) {
     /* fixup result if Montgomery reduction is used
      * recall that any value in a Montgomery system is
      * actually multiplied by R mod n.  So we have
      * to reduce one more time to cancel out the factor
      * of R.
      */
     if ((err = redux(&res, P, mp)) != MP_OKAY) {
       goto LBL_RES;
     }
  }

  /* swap res with Y */
  mp_exch (&res, Y);
  err = MP_OKAY;
LBL_RES:mp_clear (&res);
LBL_M:
  mp_clear(&M[1]);
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    mp_clear (&M[x]);
  }
  return err;
}